

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcpy.h
# Opt level: O3

int __thiscall snmalloc::X86_64Arch::copy(X86_64Arch *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 uVar1;
  long lVar2;
  EVP_PKEY_CTX *pEVar3;
  
  if (src < (EVP_PKEY_CTX *)0x11) {
    switch(src) {
    case (EVP_PKEY_CTX *)0x1:
      *this = (X86_64Arch)*dst;
      break;
    case (EVP_PKEY_CTX *)0x2:
      *(undefined2 *)this = *(undefined2 *)dst;
      break;
    case (EVP_PKEY_CTX *)0x3:
      *(undefined2 *)this = *(undefined2 *)dst;
      *(EVP_PKEY_CTX *)(this + 2) = dst[2];
      break;
    case (EVP_PKEY_CTX *)0x4:
      *(undefined4 *)this = *(undefined4 *)dst;
      break;
    case (EVP_PKEY_CTX *)0x5:
      *(undefined4 *)this = *(undefined4 *)dst;
      *(EVP_PKEY_CTX *)(this + 4) = dst[4];
      break;
    case (EVP_PKEY_CTX *)0x6:
      *(undefined4 *)this = *(undefined4 *)dst;
      *(undefined2 *)(this + 4) = *(undefined2 *)(dst + 4);
      break;
    case (EVP_PKEY_CTX *)0x7:
      *(undefined4 *)this = *(undefined4 *)dst;
      *(undefined2 *)(this + 4) = *(undefined2 *)(dst + 4);
      *(EVP_PKEY_CTX *)(this + 6) = dst[6];
      break;
    case (EVP_PKEY_CTX *)0x8:
      *(undefined8 *)this = *(undefined8 *)dst;
      break;
    case (EVP_PKEY_CTX *)0x9:
      *(undefined8 *)this = *(undefined8 *)dst;
      *(EVP_PKEY_CTX *)(this + 8) = dst[8];
      break;
    case (EVP_PKEY_CTX *)0xa:
      *(undefined8 *)this = *(undefined8 *)dst;
      *(undefined2 *)(this + 8) = *(undefined2 *)(dst + 8);
      break;
    case (EVP_PKEY_CTX *)0xb:
      *(undefined8 *)this = *(undefined8 *)dst;
      *(undefined2 *)(this + 8) = *(undefined2 *)(dst + 8);
      *(EVP_PKEY_CTX *)(this + 10) = dst[10];
      break;
    case (EVP_PKEY_CTX *)0xc:
      *(undefined8 *)this = *(undefined8 *)dst;
      *(undefined4 *)(this + 8) = *(undefined4 *)(dst + 8);
      break;
    case (EVP_PKEY_CTX *)0xd:
      *(undefined8 *)this = *(undefined8 *)dst;
      *(undefined4 *)(this + 8) = *(undefined4 *)(dst + 8);
      *(EVP_PKEY_CTX *)(this + 0xc) = dst[0xc];
      break;
    case (EVP_PKEY_CTX *)0xe:
      *(undefined8 *)this = *(undefined8 *)dst;
      *(undefined4 *)(this + 8) = *(undefined4 *)(dst + 8);
      *(undefined2 *)(this + 0xc) = *(undefined2 *)(dst + 0xc);
      break;
    case (EVP_PKEY_CTX *)0xf:
      *(undefined8 *)this = *(undefined8 *)dst;
      *(undefined4 *)(this + 8) = *(undefined4 *)(dst + 8);
      *(undefined2 *)(this + 0xc) = *(undefined2 *)(dst + 0xc);
      *(EVP_PKEY_CTX *)(this + 0xe) = dst[0xe];
      break;
    case (EVP_PKEY_CTX *)0x10:
      uVar1 = *(undefined8 *)(dst + 8);
      *(undefined8 *)this = *(undefined8 *)dst;
      *(undefined8 *)(this + 8) = uVar1;
    }
  }
  else if (src < (EVP_PKEY_CTX *)0x200) {
    lVar2 = 0;
    do {
      uVar1 = *(undefined8 *)(dst + lVar2 + 8);
      *(undefined8 *)(this + lVar2) = *(undefined8 *)(dst + lVar2);
      *(undefined8 *)(this + lVar2 + 8) = uVar1;
      pEVar3 = (EVP_PKEY_CTX *)(lVar2 + 0x20);
      lVar2 = lVar2 + 0x10;
    } while (pEVar3 <= src);
    uVar1 = *(undefined8 *)(src + -0x10 + (long)dst + 8);
    *(undefined8 *)(src + -0x10 + (long)this) = *(undefined8 *)(src + -0x10 + (long)dst);
    *(undefined8 *)(src + -0x10 + (long)this + 8) = uVar1;
  }
  else {
    copy((X86_64Arch *)dst,(EVP_PKEY_CTX *)this,src);
  }
  return (int)this;
}

Assistant:

static inline void* copy(void* dst, const void* src, size_t len)
    {
      auto orig_dst = dst;
      // If this is a small size, use a jump table for small sizes, like on the
      // generic architecture case above.
      if (len <= LargestRegisterSize)
      {
        small_copies<LargestRegisterSize>(dst, src, len);
      }

      // The Intel optimisation manual recommends doing this for sizes >256
      // bytes on modern systems and for all sizes on very modern systems.
      // Testing shows that this is somewhat overly optimistic.
      else if (SNMALLOC_UNLIKELY(len >= 512))
      {
        // Align to cache-line boundaries if possible.
        unaligned_start<64, LargestRegisterSize>(dst, src, len);
        // Bulk copy.  This is aggressively optimised on modern x86 cores.
#  ifdef __GNUC__
        asm volatile("rep movsb"
                     : "+S"(src), "+D"(dst), "+c"(len)
                     :
                     : "memory");
#  elif defined(_MSC_VER)
        __movsb(
          static_cast<unsigned char*>(dst),
          static_cast<const unsigned char*>(src),
          len);
#  else
#    error No inline assembly or rep movsb intrinsic for this compiler.
#  endif
      }

      // Otherwise do a simple bulk copy loop.
      else
      {
        block_copy<LargestRegisterSize>(dst, src, len);
        copy_end<LargestRegisterSize>(dst, src, len);
      }
      return orig_dst;
    }